

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::MergePartialFromCodedStream
          (CustomModel_CustomModelParamValue *this,CodedInputStream *input)

{
  ValueUnion *value;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint32 uVar5;
  string *psVar6;
  undefined8 *puVar7;
  uint uVar8;
  char cVar9;
  ulong uVar10;
  
  value = &this->value_;
LAB_00574dd2:
  pbVar3 = input->buffer_;
  uVar5 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar10 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar8 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar5 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar5 = uVar8, (~(uint)*pbVar1 & uVar8) < 0x80))
      goto LAB_00574f7c;
      uVar10 = (ulong)((uVar8 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar10 = uVar10 | 0x100000000;
  }
  else {
LAB_00574f7c:
    uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
    uVar10 = 0;
    if (uVar5 - 1 < 0x3fff) {
      uVar10 = 0x100000000;
    }
    uVar10 = uVar5 | uVar10;
  }
  uVar5 = (uint32)uVar10;
  if ((uVar10 & 0x100000000) != 0) {
    uVar8 = (uint)(uVar10 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar10;
    if (uVar8 == 0x3c) {
      if (cVar9 != -0x1e) goto LAB_00574e2f;
      psVar6 = mutable_bytesvalue_abi_cxx11_(this);
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
      goto LAB_00574e50;
    }
    if (uVar8 == 0x14) {
      if (cVar9 != -0x5e) goto LAB_00574e2f;
      psVar6 = mutable_stringvalue_abi_cxx11_(this);
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
      if (!bVar4) {
        return false;
      }
      puVar7 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if (this->_oneof_case_[0] == 0x14) {
        puVar7 = (undefined8 *)(this->value_).longvalue_;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                        ((char *)*puVar7,*(int *)(puVar7 + 1),PARSE,
                         "CoreML.Specification.CustomModel.CustomModelParamValue.stringValue");
      if (!bVar4) {
        return false;
      }
      goto LAB_00574dd2;
    }
    if (uVar8 == 0x1e) {
      if (cVar9 == -0x10) {
        clear_value(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,&value->intvalue_);
        goto LAB_00574efa;
      }
    }
    else if (uVar8 == 0x28) {
      if (cVar9 == '@') {
        clear_value(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,&value->longvalue_);
        goto LAB_00574efa;
      }
    }
    else if (uVar8 == 0x32) {
      if (cVar9 == -0x70) {
        clear_value(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&value->boolvalue_);
        goto LAB_00574efa;
      }
    }
    else if ((uVar8 == 10) && (cVar9 == 'Q')) {
      clear_value(this);
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                        (input,&value->doublevalue_);
LAB_00574efa:
      if (bVar4 == false) {
        return false;
      }
      this->_oneof_case_[0] = uVar8;
      goto LAB_00574dd2;
    }
  }
LAB_00574e2f:
  if (uVar5 == 0) {
    return true;
  }
  if ((uVar5 & 7) == 4) {
    return true;
  }
  bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_00574e50:
  if (bVar4 == false) {
    return false;
  }
  goto LAB_00574dd2;
}

Assistant:

bool CustomModel_CustomModelParamValue::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // double doubleValue = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(81u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &value_.doublevalue_)));
          set_has_doublevalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string stringValue = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_stringvalue()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->stringvalue().data(), this->stringvalue().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomModel.CustomModelParamValue.stringValue"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 intValue = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(240u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &value_.intvalue_)));
          set_has_intvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 longValue = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(320u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &value_.longvalue_)));
          set_has_longvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool boolValue = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(400u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &value_.boolvalue_)));
          set_has_boolvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes bytesValue = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(482u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_bytesvalue()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CustomModel.CustomModelParamValue)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CustomModel.CustomModelParamValue)
  return false;
#undef DO_
}